

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O3

float compute_error_of_weight_set_1plane
                (endpoints_and_weights *eai,decimation_info *di,float *dec_weight_quant_uvalue)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  uint i;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 in_ZMM2 [64];
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 in_ZMM3 [64];
  undefined1 auVar27 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar28 [32];
  undefined1 in_ZMM5 [64];
  undefined1 in_ZMM6 [64];
  
  uVar11 = (ulong)di->texel_count;
  if (uVar11 != 0) {
    auVar15 = ZEXT1664(ZEXT816(0) << 0x40);
    if (di->max_texel_weight_count < 3) {
      if (di->max_texel_weight_count == 2) {
        uVar12 = 0;
        do {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)(di->texel_weights_tr[0] + uVar12);
          auVar17 = vpmovzxbd_avx2(auVar10);
          auVar28 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(di->texel_weights_tr[1] + uVar12);
          vpmovzxbd_avx2(auVar9);
          auVar20 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar28);
          auVar28 = vpcmpeqd_avx2(auVar17,auVar17);
          auVar17 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar28);
          pfVar4 = di->texel_weight_contribs_float_tr[0] + uVar12;
          pfVar1 = di->texel_weight_contribs_float_tr[1] + uVar12;
          fVar18 = auVar17._0_4_ * *pfVar1;
          fVar21 = auVar17._4_4_ * pfVar1[1];
          fVar22 = auVar17._8_4_ * pfVar1[2];
          fVar23 = auVar17._12_4_ * pfVar1[3];
          fVar24 = auVar17._16_4_ * pfVar1[4];
          fVar25 = auVar17._20_4_ * pfVar1[5];
          fVar26 = auVar17._24_4_ * pfVar1[6];
          in_ZMM2 = ZEXT3264(CONCAT428(auVar17._28_4_,
                                       CONCAT424(fVar26,CONCAT420(fVar25,CONCAT416(fVar24,CONCAT412(
                                                  fVar23,CONCAT48(fVar22,CONCAT44(fVar21,fVar18)))))
                                                )));
          auVar28._0_4_ = auVar20._0_4_ * *pfVar4 + fVar18;
          auVar28._4_4_ = auVar20._4_4_ * pfVar4[1] + fVar21;
          auVar28._8_4_ = auVar20._8_4_ * pfVar4[2] + fVar22;
          auVar28._12_4_ = auVar20._12_4_ * pfVar4[3] + fVar23;
          auVar28._16_4_ = auVar20._16_4_ * pfVar4[4] + fVar24;
          auVar28._20_4_ = auVar20._20_4_ * pfVar4[5] + fVar25;
          auVar28._24_4_ = auVar20._24_4_ * pfVar4[6] + fVar26;
          auVar28._28_4_ = auVar17._28_4_ + 0.0;
          auVar28 = vsubps_avx(auVar28,*(undefined1 (*) [32])(eai->weights + uVar12));
          pfVar4 = eai->weight_error_scale + uVar12;
          fVar18 = auVar28._4_4_ * auVar28._4_4_ * pfVar4[1];
          auVar13._0_4_ =
               auVar28._16_4_ * auVar28._16_4_ * pfVar4[4] +
               auVar15._0_4_ + auVar28._0_4_ * auVar28._0_4_ * *pfVar4;
          auVar13._4_4_ = fVar18 + auVar15._4_4_ + fVar18;
          auVar13._8_4_ =
               auVar28._24_4_ * auVar28._24_4_ * pfVar4[6] +
               auVar15._8_4_ + auVar28._8_4_ * auVar28._8_4_ * pfVar4[2];
          auVar13._12_4_ =
               auVar28._28_4_ + auVar15._12_4_ + auVar28._12_4_ * auVar28._12_4_ * pfVar4[3];
          auVar15 = ZEXT1664(auVar13);
          uVar12 = uVar12 + 8;
        } while (uVar12 < uVar11);
      }
      else {
        uVar12 = 0;
        do {
          auVar28 = vsubps_avx(*(undefined1 (*) [32])(dec_weight_quant_uvalue + uVar12),
                               *(undefined1 (*) [32])(eai->weights + uVar12));
          pfVar4 = eai->weight_error_scale + uVar12;
          fVar18 = auVar28._4_4_ * auVar28._4_4_ * pfVar4[1];
          auVar13._0_4_ =
               auVar28._16_4_ * auVar28._16_4_ * pfVar4[4] +
               auVar15._0_4_ + auVar28._0_4_ * auVar28._0_4_ * *pfVar4;
          auVar13._4_4_ = fVar18 + auVar15._4_4_ + fVar18;
          auVar13._8_4_ =
               auVar28._24_4_ * auVar28._24_4_ * pfVar4[6] +
               auVar15._8_4_ + auVar28._8_4_ * auVar28._8_4_ * pfVar4[2];
          auVar13._12_4_ =
               auVar28._28_4_ + auVar15._12_4_ + auVar28._12_4_ * auVar28._12_4_ * pfVar4[3];
          auVar15 = ZEXT1664(auVar13);
          uVar12 = uVar12 + 8;
        } while (uVar12 < uVar11);
      }
    }
    else {
      uVar12 = 0;
      do {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *(ulong *)(di->texel_weights_tr[0] + uVar12);
        vpmovzxbd_avx2(auVar5);
        auVar28 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
        auVar16 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar28);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(ulong *)(di->texel_weights_tr[1] + uVar12);
        vpmovzxbd_avx2(auVar6);
        auVar28 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
        auVar19 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar28);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(ulong *)(di->texel_weights_tr[2] + uVar12);
        vpmovzxbd_avx2(auVar7);
        auVar28 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
        auVar27 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar28);
        in_ZMM4 = ZEXT3264(auVar27);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)(di->texel_weights_tr[3] + uVar12);
        auVar17 = vpmovzxbd_avx2(auVar8);
        auVar28 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
        pfVar4 = di->texel_weight_contribs_float_tr[0] + uVar12;
        auVar28 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar28);
        in_ZMM5 = ZEXT3264(auVar28);
        in_ZMM6 = ZEXT3264((undefined1  [32])0x0);
        pfVar1 = di->texel_weight_contribs_float_tr[1] + uVar12;
        pfVar2 = di->texel_weight_contribs_float_tr[2] + uVar12;
        pfVar3 = di->texel_weight_contribs_float_tr[3] + uVar12;
        fVar18 = auVar28._0_4_ * *pfVar3;
        fVar21 = auVar28._4_4_ * pfVar3[1];
        fVar22 = auVar28._8_4_ * pfVar3[2];
        fVar23 = auVar28._12_4_ * pfVar3[3];
        fVar24 = auVar28._16_4_ * pfVar3[4];
        fVar25 = auVar28._20_4_ * pfVar3[5];
        fVar26 = auVar28._24_4_ * pfVar3[6];
        in_ZMM3 = ZEXT3264(CONCAT428(auVar19._28_4_,
                                     CONCAT424(fVar26,CONCAT420(fVar25,CONCAT416(fVar24,CONCAT412(
                                                  fVar23,CONCAT48(fVar22,CONCAT44(fVar21,fVar18)))))
                                              )));
        auVar20._0_4_ =
             auVar16._0_4_ * *pfVar4 + auVar19._0_4_ * *pfVar1 + auVar27._0_4_ * *pfVar2 + fVar18;
        auVar20._4_4_ =
             auVar16._4_4_ * pfVar4[1] + auVar19._4_4_ * pfVar1[1] +
             auVar27._4_4_ * pfVar2[1] + fVar21;
        auVar20._8_4_ =
             auVar16._8_4_ * pfVar4[2] + auVar19._8_4_ * pfVar1[2] +
             auVar27._8_4_ * pfVar2[2] + fVar22;
        auVar20._12_4_ =
             auVar16._12_4_ * pfVar4[3] + auVar19._12_4_ * pfVar1[3] +
             auVar27._12_4_ * pfVar2[3] + fVar23;
        auVar20._16_4_ =
             auVar16._16_4_ * pfVar4[4] + auVar19._16_4_ * pfVar1[4] +
             auVar27._16_4_ * pfVar2[4] + fVar24;
        auVar20._20_4_ =
             auVar16._20_4_ * pfVar4[5] + auVar19._20_4_ * pfVar1[5] +
             auVar27._20_4_ * pfVar2[5] + fVar25;
        auVar20._24_4_ =
             auVar16._24_4_ * pfVar4[6] + auVar19._24_4_ * pfVar1[6] +
             auVar27._24_4_ * pfVar2[6] + fVar26;
        auVar20._28_4_ = auVar16._28_4_ + auVar17._28_4_ + auVar16._28_4_ + auVar19._28_4_;
        auVar28 = vsubps_avx(auVar20,*(undefined1 (*) [32])(eai->weights + uVar12));
        pfVar4 = eai->weight_error_scale + uVar12;
        fVar18 = auVar28._4_4_ * auVar28._4_4_ * pfVar4[1];
        auVar13._0_4_ =
             auVar28._16_4_ * auVar28._16_4_ * pfVar4[4] +
             auVar15._0_4_ + auVar28._0_4_ * auVar28._0_4_ * *pfVar4;
        auVar13._4_4_ = fVar18 + auVar15._4_4_ + fVar18;
        auVar13._8_4_ =
             auVar28._24_4_ * auVar28._24_4_ * pfVar4[6] +
             auVar15._8_4_ + auVar28._8_4_ * auVar28._8_4_ * pfVar4[2];
        auVar13._12_4_ =
             auVar28._28_4_ + auVar15._12_4_ + auVar28._12_4_ * auVar28._12_4_ * pfVar4[3];
        auVar15 = ZEXT1664(auVar13);
        uVar12 = uVar12 + 8;
      } while (uVar12 < uVar11);
    }
    auVar10 = vshufpd_avx(auVar13,auVar13,1);
    auVar14._0_4_ = auVar13._0_4_ + auVar10._0_4_;
    auVar14._4_4_ = auVar13._4_4_ + auVar10._4_4_;
    auVar14._8_4_ = auVar13._8_4_ + auVar10._8_4_;
    auVar14._12_4_ = auVar13._12_4_ + auVar10._12_4_;
    auVar13 = vhaddps_avx(auVar14,auVar14);
    return auVar13._0_4_;
  }
  __assert_fail("texel_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                ,0x2b7,
                "float compute_error_of_weight_set_1plane(const endpoints_and_weights &, const decimation_info &, const float *)"
               );
}

Assistant:

float compute_error_of_weight_set_1plane(
	const endpoints_and_weights& eai,
	const decimation_info& di,
	const float* dec_weight_quant_uvalue
) {
	vfloatacc error_summav = vfloatacc::zero();
	unsigned int texel_count = di.texel_count;
	promise(texel_count > 0);

	// Process SIMD-width chunks, safe to over-fetch - the extra space is zero initialized
	if (di.max_texel_weight_count > 2)
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values = bilinear_infill_vla(di, dec_weight_quant_uvalue, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values = loada(eai.weights + i);
			vfloat diff = current_values - actual_values;
			vfloat significance = loada(eai.weight_error_scale + i);
			vfloat error = diff * diff * significance;

			haccumulate(error_summav, error);
		}
	}
	else if (di.max_texel_weight_count > 1)
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values = bilinear_infill_vla_2(di, dec_weight_quant_uvalue, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values = loada(eai.weights + i);
			vfloat diff = current_values - actual_values;
			vfloat significance = loada(eai.weight_error_scale + i);
			vfloat error = diff * diff * significance;

			haccumulate(error_summav, error);
		}
	}
	else
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Load the weight set directly, without interpolation
			vfloat current_values = loada(dec_weight_quant_uvalue + i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values = loada(eai.weights + i);
			vfloat diff = current_values - actual_values;
			vfloat significance = loada(eai.weight_error_scale + i);
			vfloat error = diff * diff * significance;

			haccumulate(error_summav, error);
		}
	}

	// Resolve the final scalar accumulator sum
	return hadd_s(error_summav);
}